

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O2

void __thiscall
pg::ZLKPPSolver::solve_liverpool
          (ZLKPPSolver *this,int max_priority,int prec_cur,int prec_opo,bool *reached_bottom_cur,
          bool *reached_bottom_opo)

{
  int iVar1;
  bool bVar2;
  int prec_opo_00;
  int dummy;
  
  do {
    iVar1 = this->cur_num_nodes;
    prec_opo_00 = prec_opo / 2;
    if (this->min_dominion <= prec_opo_00) {
      solve_liverpool(this,max_priority,prec_cur,prec_opo_00,reached_bottom_cur,reached_bottom_opo);
    }
  } while (((prec_opo_00 < iVar1) &&
           (bVar2 = do_step(this,max_priority,prec_cur,prec_opo,&dummy,reached_bottom_cur,
                            reached_bottom_opo), bVar2)) &&
          (prec_opo = prec_opo_00, this->min_dominion <= prec_opo_00));
  return;
}

Assistant:

void ZLKPPSolver::solve_liverpool(int max_priority, int prec_cur, int prec_opo, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    int initial_num_nodes = cur_num_nodes, dummy;
    if (prec_opo / 2 >= min_dominion)
        solve_liverpool(max_priority, prec_cur, prec_opo / 2, reached_bottom_cur, reached_bottom_opo);
    if (initial_num_nodes <= prec_opo / 2)
        return;
    if (do_step(max_priority, prec_cur, prec_opo, dummy, reached_bottom_cur, reached_bottom_opo) && prec_opo / 2 >= min_dominion)
        solve_liverpool(max_priority, prec_cur, prec_opo / 2, reached_bottom_cur, reached_bottom_opo);
}